

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

float64 gauden_mixture(float64 **den,uint32 **den_idx,float32 **w,gauden_t *g)

{
  ulong uVar1;
  ulong uVar2;
  float64 fVar3;
  double dVar4;
  
  if ((ulong)g->n_feat == 0) {
    fVar3 = 1.0;
  }
  else {
    fVar3 = 1.0;
    uVar2 = 0;
    do {
      if ((ulong)g->n_top == 0) {
        dVar4 = 0.0;
      }
      else {
        dVar4 = 0.0;
        uVar1 = 0;
        do {
          dVar4 = dVar4 + (double)(float)w[uVar2][den_idx[uVar2][uVar1]] * (double)den[uVar2][uVar1]
          ;
          uVar1 = uVar1 + 1;
        } while (g->n_top != uVar1);
      }
      fVar3 = (float64)((double)fVar3 * dVar4);
      uVar2 = uVar2 + 1;
    } while (uVar2 != g->n_feat);
  }
  return fVar3;
}

Assistant:

float64
gauden_mixture(float64 **den,
	       uint32 **den_idx,
	       float32 **w,
	       gauden_t *g)
{
    float64 out;
    uint32 j;

    out = 1.0;
    for (j = 0; j < g->n_feat; j++) {
	uint32 kk;
	float64 oprob;

	oprob = 0;
	kk = 0;
 	while (kk < g->n_top) {
	    uint32 k;
	    k = den_idx[j][kk];
	    oprob += w[j][k] * den[j][kk];
	    ++kk;
	}

	out *= oprob;
    }

    return out;
}